

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::Subcase::~Subcase(Subcase *this)

{
  bool bVar1;
  int iVar2;
  reference ppIVar3;
  String *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_bool>
  pVar4;
  IReporter **curr_rep_1;
  iterator __end3;
  iterator __begin3;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range3;
  IReporter **curr_rep;
  iterator __end4;
  iterator __begin4;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range4;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  _Rb_tree_const_iterator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>
  in_stack_ffffffffffffff78;
  value_type *in_stack_ffffffffffffff88;
  set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_68;
  long local_60;
  undefined1 local_58 [24];
  undefined1 local_40;
  reference local_38;
  IReporter **local_30;
  __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
  local_28;
  long local_20;
  _Base_ptr local_18;
  undefined1 local_10;
  
  if ((in_RDI[1].field_0.buf[0x10] & 1U) != 0) {
    if ((*(byte *)(g_cs + 0x115c) & 1) == 0) {
      pVar4 = std::
              set<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
              ::insert(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff78 = pVar4.first._M_node;
      in_stack_ffffffffffffff77 = pVar4.second;
      local_18 = in_stack_ffffffffffffff78._M_node;
      local_10 = in_stack_ffffffffffffff77;
    }
    std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::pop_back
              ((vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_> *)
               0x10ff90);
    iVar2 = std::uncaught_exceptions();
    if ((0 < iVar2) &&
       (bVar1 = std::atomic::operator_cast_to_bool
                          ((atomic<bool> *)in_stack_ffffffffffffff78._M_node), bVar1)) {
      local_20 = g_cs + 0x10d0;
      local_28._M_current =
           (IReporter **)
           std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                     (in_stack_ffffffffffffff68);
      local_30 = (IReporter **)
                 std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
                           (in_stack_ffffffffffffff68);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                                (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                 *)in_stack_ffffffffffffff68), bVar1) {
        local_38 = __gnu_cxx::
                   __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                   ::operator*(&local_28);
        in_stack_ffffffffffffff68 =
             (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)*local_38;
        String::String(in_RDI,(char *)in_stack_ffffffffffffff78._M_node);
        local_40 = 0;
        (*(code *)(in_stack_ffffffffffffff68->
                  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[6])(in_stack_ffffffffffffff68,local_58);
        TestCaseException::~TestCaseException((TestCaseException *)0x110050);
        __gnu_cxx::
        __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
        ::operator++(&local_28);
      }
      std::atomic<bool>::operator=
                ((atomic<bool> *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 SUB81((ulong)in_stack_ffffffffffffff68 >> 0x38,0));
    }
    local_60 = g_cs + 0x10d0;
    local_68._M_current =
         (IReporter **)
         std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin
                   (in_stack_ffffffffffffff68);
    std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end
              (in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                              (__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                ::operator*(&local_68);
      (*(*ppIVar3)->_vptr_IReporter[8])();
      __gnu_cxx::
      __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
      ::operator++(&local_68);
    }
  }
  SubcaseSignature::~SubcaseSignature((SubcaseSignature *)0x1100f2);
  return;
}

Assistant:

Subcase::~Subcase() {
        if(m_entered) {
            // only mark the subcase stack as passed if no subcases have been skipped
            if(g_cs->should_reenter == false)
                g_cs->subcasesPassed.insert(g_cs->subcasesStack);
            g_cs->subcasesStack.pop_back();

#if defined(__cpp_lib_uncaught_exceptions) && __cpp_lib_uncaught_exceptions >= 201411L && (!defined(__MAC_OS_X_VERSION_MIN_REQUIRED) || __MAC_OS_X_VERSION_MIN_REQUIRED >= 101200)
            if(std::uncaught_exceptions() > 0
#else
            if(std::uncaught_exception()
#endif
            && g_cs->shouldLogCurrentException) {
                DOCTEST_ITERATE_THROUGH_REPORTERS(
                        test_case_exception, {"exception thrown in subcase - will translate later "
                                              "when the whole test case has been exited (cannot "
                                              "translate while there is an active exception)",
                                              false});
                g_cs->shouldLogCurrentException = false;
            }
            DOCTEST_ITERATE_THROUGH_REPORTERS(subcase_end, DOCTEST_EMPTY);
        }
    }